

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

size_t utf8_ptr::s_len(char *p,size_t bytecnt)

{
  long in_RSI;
  char *in_RDI;
  size_t cnt;
  char *end;
  char *p_00;
  char *local_8;
  
  p_00 = (char *)0x0;
  local_8 = in_RDI;
  while (local_8 < in_RDI + in_RSI) {
    local_8 = s_inc(p_00);
    p_00 = p_00 + 1;
  }
  return (size_t)p_00;
}

Assistant:

static size_t s_len(const char *p, size_t bytecnt)
    {
        /* get the ending pointer */
        const char *end = p + bytecnt;

        /* increment until we run out of bytes */ 
        size_t cnt;
        for (cnt = 0 ; p < end ; p = s_inc(p), ++cnt) ;

        /* return the result */
        return cnt;
    }